

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall GdlRuleItem::AssignFsmInternalID(GdlRuleItem *this,GrcManager *pcman,int nPassID)

{
  GdlDefn *pGVar1;
  undefined8 in_RSI;
  GdlGlyphClassDefn *in_RDI;
  GrcManager *unaff_retaddr;
  GdlGlyphClassDefn *pglfcIn;
  int nPassID_00;
  
  nPassID_00 = (int)((ulong)in_RSI >> 0x20);
  if ((*(long *)&in_RDI->m_staName != 0) &&
     (pGVar1 = GrcSymbolTableEntry::Data(*(GrcSymbolTableEntry **)&in_RDI->m_staName),
     pGVar1 != (GdlDefn *)0x0)) {
    GrcSymbolTableEntry::GlyphClassDefnData((GrcSymbolTableEntry *)in_RDI);
    GrcManager::AddToFsmClasses(unaff_retaddr,in_RDI,nPassID_00);
  }
  return;
}

Assistant:

void GdlRuleItem::AssignFsmInternalID(GrcManager * pcman, int nPassID)
{
	if (!m_psymInput)
		//	Already recorded an error--undefined class.
		return;

	if (m_psymInput->Data())
	{
		GdlGlyphClassDefn * pglfcIn = m_psymInput->GlyphClassDefnData();
		Assert(pglfcIn);
		pcman->AddToFsmClasses(pglfcIn, nPassID);
	}
	//	else insertion
}